

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O3

bool __thiscall
mjs::string_object::do_redefine_own_property
          (string_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  uint *puVar2;
  wstring_view wVar3;
  
  puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
  wVar3._M_len = (ulong)*puVar2;
  wVar3._M_str = (wchar_t *)(puVar2 + 1);
  wVar3 = handle_array_like_access(this,wVar3);
  if (wVar3._M_len != 0) {
    return false;
  }
  bVar1 = native_object::do_redefine_own_property(&this->super_native_object,name,val,attr);
  return bVar1;
}

Assistant:

bool do_redefine_own_property(const string& name, const value& val, property_attribute attr) override {
        if (const auto s = handle_array_like_access(name.view()); !s.empty()) {
            return false;
        }
        return native_object::do_redefine_own_property(name, val, attr);
    }